

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O2

int parse_arguments(pExecutor exec,pUserFunction func,Expr *args,int argc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  size_t sVar4;
  int iVar5;
  Expr *__ptr;
  Expr *pEVar6;
  Expr *pEVar7;
  long lVar8;
  ulong uVar9;
  uint uVar11;
  size_t __size;
  size_t sVar12;
  Expr EVar13;
  int rest_pos;
  int opt_pos;
  pUserFunction local_48;
  size_t local_40;
  long local_38;
  anon_union_8_8_707b72ea_for_Expr_1 aVar10;
  
  iVar5 = scan_arguments(exec,args,argc,&opt_pos,&rest_pos);
  if (iVar5 != 0) {
    local_38 = (long)rest_pos;
    uVar11 = ~opt_pos + rest_pos;
    if (~opt_pos + rest_pos < 1) {
      uVar11 = 0;
    }
    local_40 = (long)opt_pos << 4;
    __ptr = (Expr *)malloc(local_40);
    if (__ptr == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
      return 0;
    }
    __size = (ulong)uVar11 << 4;
    pEVar6 = (Expr *)malloc(__size);
    if (pEVar6 == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
    }
    else {
      pEVar7 = (Expr *)malloc(__size);
      sVar4 = local_40;
      if (pEVar7 != (Expr *)0x0) {
        lVar8 = 0;
        uVar9 = 0;
        if (0 < opt_pos) {
          uVar9 = (ulong)(uint)opt_pos;
        }
        for (; uVar9 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
          puVar1 = (undefined8 *)((long)&args->type + lVar8);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)&__ptr->type + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
        }
        local_48 = func;
        for (sVar12 = 0; __size != sVar12; sVar12 = sVar12 + 0x10) {
          EVar13._4_4_ = 0;
          EVar13.type = *(uint *)((long)&args[1].type + sVar12 + sVar4);
          EVar13.field_1.val_atom =
               ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args[1].field_1 + sVar12 + sVar4))->
               val_atom;
          parse_opt_arg(exec,EVar13,(Expr *)((long)&pEVar6->type + sVar12),
                        (Expr *)((long)&pEVar7->type + sVar12));
        }
        if ((int)local_38 == argc) {
          EVar13 = make_none();
          aVar10 = EVar13.field_1;
          uVar9 = (ulong)EVar13.type;
        }
        else {
          uVar9 = *(ulong *)(args + local_38 + 1);
          aVar10 = args[local_38 + 1].field_1;
        }
        local_48->args = __ptr;
        local_48->argc = opt_pos;
        local_48->opt = pEVar6;
        local_48->def = pEVar7;
        local_48->optc = uVar11;
        *(ulong *)&local_48->rest = uVar9;
        (local_48->rest).field_1.val_atom = (size_t)aVar10;
        return 1;
      }
      puts("parse_arguments: malloc failed");
      free(__ptr);
      __ptr = pEVar6;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int parse_arguments(pExecutor exec, pUserFunction func, Expr *args, int argc)
{
    int opt_pos, rest_pos;
    if (!scan_arguments(exec, args, argc, &opt_pos, &rest_pos))
        return 0;

    int req_len = opt_pos;
    int opt_len = rest_pos - opt_pos - 1;
    if (opt_len < 0) opt_len = 0;
    int rest_len = argc - rest_pos;

    Expr *req, *opt, *def, rest;

    req = malloc(req_len * sizeof(Expr));
    if (req == NULL)
    {
        log("parse_arguments: malloc failed");
        return 0;
    }
    opt = malloc(opt_len * sizeof(Expr));
    if (opt == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        return 0;
    }
    def = malloc(opt_len * sizeof(Expr));
    if (def == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        free(opt);
        return 0;
    }

    for (int i = 0; i < req_len; i++)
        req[i] = args[i];
    for (int i = 0; i < opt_len; i++)
        parse_opt_arg(exec, args[opt_pos + 1 + i], opt + i, def + i);
    if (rest_len != 0)
        rest = args[rest_pos + 1];
    else
        rest = make_none();

    func->args = req;
    func->argc = req_len;
    func->opt = opt;
    func->def = def;
    func->optc = opt_len;
    func->rest = rest;

    return 1;
}